

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMCasts.hpp
# Opt level: O2

DOMChildNode * xercesc_4_0::castToChildImpl(DOMNode *p)

{
  long *plVar1;
  long lVar2;
  DOMChildNode *pDVar3;
  DOMException *this;
  
  if (p != (DOMNode *)0x0) {
    plVar1 = (long *)__dynamic_cast(p,&DOMNode::typeinfo,&HasDOMChildImpl::typeinfo,
                                    0xfffffffffffffffe);
    if (plVar1 != (long *)0x0) {
      lVar2 = (**(code **)(*plVar1 + 0x10))(plVar1);
      if (lVar2 != 0) {
        pDVar3 = (DOMChildNode *)(**(code **)(*plVar1 + 0x10))(plVar1);
        return pDVar3;
      }
    }
  }
  this = (DOMException *)__cxa_allocate_exception(0x28);
  DOMException::DOMException(this,0xb,0,XMLPlatformUtils::fgMemoryManager);
  __cxa_throw(this,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

static inline DOMChildNode *castToChildImpl(DOMNode *p) {
    HasDOMChildImpl *pE = dynamic_cast<HasDOMChildImpl*>(p);
    if (!pE || !pE->getChildNodeImpl()) {
        throw DOMException(DOMException::INVALID_STATE_ERR, 0, XMLPlatformUtils::fgMemoryManager);
    }
    return pE->getChildNodeImpl();
}